

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::SceneGraph::convert_mblur_to_nonmblur(Ref<embree::SceneGraph::Node> *node)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Node *pNVar3;
  long lVar4;
  void *pvVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar3 = node->ptr;
  if (pNVar3 != (Node *)0x0) {
    plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TransformNode::typeinfo);
    if (plVar7 == (long *)0x0) {
      plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar7 == (long *)0x0) {
          plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
          if (plVar7 == (long *)0x0) {
            plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
            if (plVar7 == (long *)0x0) {
              plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&HairSetNode::typeinfo,0);
              if (plVar7 == (long *)0x0) {
                plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&PointSetNode::typeinfo,0);
                if (plVar7 == (long *)0x0) {
                  plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&SubdivMeshNode::typeinfo,0
                                                 );
                  if (plVar7 == (long *)0x0) {
                    plVar7 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GridMeshNode::typeinfo,0
                                                   );
                    if (plVar7 != (long *)0x0) {
                      (**(code **)(*plVar7 + 0x10))(plVar7);
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(plVar7 + 0xe),1);
                      (**(code **)(*plVar7 + 0x18))(plVar7);
                    }
                  }
                  else {
                    (**(code **)(*plVar7 + 0x10))(plVar7);
                    if (plVar7[0xf] != plVar7[0xe]) {
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(plVar7 + 0xe),1);
                    }
                    if (plVar7[0x12] != plVar7[0x11]) {
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(plVar7 + 0x11),1);
                    }
                    (**(code **)(*plVar7 + 0x18))(plVar7);
                  }
                }
                else {
                  (**(code **)(*plVar7 + 0x10))(plVar7);
                  if (plVar7[0x10] != plVar7[0xf]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              *)(plVar7 + 0xf),1);
                  }
                  if (plVar7[0x13] != plVar7[0x12]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(plVar7 + 0x12),1);
                  }
                  (**(code **)(*plVar7 + 0x18))(plVar7);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x10))(plVar7);
                if (plVar7[0x10] != plVar7[0xf]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar7 + 0xf),1);
                }
                if (plVar7[0x13] != plVar7[0x12]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(plVar7 + 0x12),1);
                }
                if (plVar7[0x16] != plVar7[0x15]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar7 + 0x15),1);
                }
                if (plVar7[0x19] != plVar7[0x18]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(plVar7 + 0x18),1);
                }
                (**(code **)(*plVar7 + 0x18))(plVar7);
              }
            }
            else {
              (**(code **)(*plVar7 + 0x10))(plVar7);
              if (plVar7[0xf] != plVar7[0xe]) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(plVar7 + 0xe),1);
              }
              if (plVar7[0x12] != plVar7[0x11]) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(plVar7 + 0x11),1);
              }
              (**(code **)(*plVar7 + 0x18))(plVar7);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x10))(plVar7);
            if (plVar7[0xf] != plVar7[0xe]) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar7 + 0xe),1);
            }
            if (plVar7[0x12] != plVar7[0x11]) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar7 + 0x11),1);
            }
            (**(code **)(*plVar7 + 0x18))(plVar7);
          }
        }
        else {
          (**(code **)(*plVar7 + 0x10))(plVar7);
          lVar11 = plVar7[0xd];
          if (plVar7[0xe] != lVar11) {
            uVar13 = 0;
            do {
              pNVar3 = *(Node **)(lVar11 + uVar13 * 8);
              local_48.ptr = pNVar3;
              if (pNVar3 != (Node *)0x0) {
                (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
              }
              convert_mblur_to_nonmblur(&local_48);
              if (pNVar3 != (Node *)0x0) {
                (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
              }
              uVar13 = uVar13 + 1;
              lVar11 = plVar7[0xd];
            } while (uVar13 < (ulong)(plVar7[0xe] - lVar11 >> 3));
          }
          (**(code **)(*plVar7 + 0x18))(plVar7);
        }
      }
      else {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        lVar11 = plVar7[0xd];
        if (plVar7[0xe] != lVar11) {
          uVar13 = 0;
          do {
            lVar11 = lVar11 + uVar13 * 0x30;
            lVar10 = *(long *)(lVar11 + 0x18);
            if (1 < *(ulong *)(lVar11 + 0x10)) {
              *(undefined8 *)(lVar11 + 0x10) = 1;
            }
            if (lVar10 == 0) {
              pvVar5 = *(void **)(lVar11 + 0x20);
              pvVar9 = alignedMalloc(0x40,0x10);
              *(void **)(lVar11 + 0x20) = pvVar9;
              if (*(long *)(lVar11 + 0x10) != 0) {
                lVar8 = 0x30;
                uVar12 = 0;
                do {
                  lVar4 = *(long *)(lVar11 + 0x20);
                  puVar1 = (undefined8 *)((long)pvVar5 + lVar8 + -0x30);
                  uVar6 = puVar1[1];
                  puVar2 = (undefined8 *)(lVar4 + -0x30 + lVar8);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar6;
                  puVar1 = (undefined8 *)((long)pvVar5 + lVar8 + -0x20);
                  uVar6 = puVar1[1];
                  puVar2 = (undefined8 *)(lVar4 + -0x20 + lVar8);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar6;
                  puVar1 = (undefined8 *)((long)pvVar5 + lVar8 + -0x10);
                  uVar6 = puVar1[1];
                  puVar2 = (undefined8 *)(lVar4 + -0x10 + lVar8);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar6;
                  uVar6 = ((undefined8 *)((long)pvVar5 + lVar8))[1];
                  *(undefined8 *)(lVar4 + lVar8) = *(undefined8 *)((long)pvVar5 + lVar8);
                  ((undefined8 *)(lVar4 + lVar8))[1] = uVar6;
                  uVar12 = uVar12 + 1;
                  lVar8 = lVar8 + 0x40;
                } while (uVar12 < *(ulong *)(lVar11 + 0x10));
              }
              alignedFree(pvVar5);
              *(undefined8 *)(lVar11 + 0x10) = 1;
              *(ulong *)(lVar11 + 0x18) = lVar10 + (ulong)(lVar10 == 0);
            }
            else {
              *(undefined8 *)(lVar11 + 0x10) = 1;
            }
            uVar13 = uVar13 + 1;
            lVar11 = plVar7[0xd];
          } while (uVar13 < (ulong)((plVar7[0xe] - lVar11 >> 4) * -0x5555555555555555));
        }
        pNVar3 = (Node *)plVar7[0x10];
        local_40.ptr = pNVar3;
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
        }
        convert_mblur_to_nonmblur(&local_40);
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
        }
        (**(code **)(*plVar7 + 0x18))(plVar7);
      }
    }
    else {
      (**(code **)(*plVar7 + 0x10))(plVar7);
      lVar11 = plVar7[0x10];
      if (1 < (ulong)plVar7[0xf]) {
        plVar7[0xf] = 1;
      }
      if (lVar11 == 0) {
        pvVar5 = (void *)plVar7[0x11];
        pvVar9 = alignedMalloc(0x40,0x10);
        plVar7[0x11] = (long)pvVar9;
        if (plVar7[0xf] != 0) {
          lVar10 = 0x30;
          uVar13 = 0;
          do {
            lVar8 = plVar7[0x11];
            puVar1 = (undefined8 *)((long)pvVar5 + lVar10 + -0x30);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)(lVar8 + -0x30 + lVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            puVar1 = (undefined8 *)((long)pvVar5 + lVar10 + -0x20);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)(lVar8 + -0x20 + lVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            puVar1 = (undefined8 *)((long)pvVar5 + lVar10 + -0x10);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)(lVar8 + -0x10 + lVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            uVar6 = ((undefined8 *)((long)pvVar5 + lVar10))[1];
            *(undefined8 *)(lVar8 + lVar10) = *(undefined8 *)((long)pvVar5 + lVar10);
            ((undefined8 *)(lVar8 + lVar10))[1] = uVar6;
            uVar13 = uVar13 + 1;
            lVar10 = lVar10 + 0x40;
          } while (uVar13 < (ulong)plVar7[0xf]);
        }
        alignedFree(pvVar5);
        plVar7[0xf] = 1;
        plVar7[0x10] = lVar11 + (ulong)(lVar11 == 0);
      }
      else {
        plVar7[0xf] = 1;
      }
      pNVar3 = (Node *)plVar7[0x13];
      local_38.ptr = pNVar3;
      if (pNVar3 != (Node *)0x0) {
        (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
      }
      convert_mblur_to_nonmblur(&local_38);
      if (pNVar3 != (Node *)0x0) {
        (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
      }
      (**(code **)(*plVar7 + 0x18))(plVar7);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }